

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_filter.cpp
# Opt level: O2

unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true> __thiscall
duckdb::DynamicTableFilterSet::GetFinalTableFilters
          (DynamicTableFilterSet *this,PhysicalTableScan *scan,
          optional_ptr<duckdb::TableFilterSet,_true> existing_filters)

{
  pointer pLVar1;
  __uniq_ptr_impl<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_> _Var2;
  TableFilterSet *pTVar3;
  pointer pTVar4;
  pointer pTVar5;
  _Base_ptr p_Var6;
  pointer this_00;
  _Head_base<0UL,_duckdb::TableFilterSet_*,_false> _Var7;
  long in_RCX;
  templated_unique_single_t result;
  _Head_base<0UL,_duckdb::TableFilterSet_*,_false> local_80;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> local_78;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> local_70;
  PhysicalTableScan *local_68;
  __uniq_ptr_impl<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_> local_60;
  optional_ptr<duckdb::TableFilterSet,_true> local_58;
  ColumnIndex local_50;
  
  local_68 = scan;
  local_60._M_t.
  super__Tuple_impl<0UL,_duckdb::TableFilterSet_*,_std::default_delete<duckdb::TableFilterSet>_>.
  super__Head_base<0UL,_duckdb::TableFilterSet_*,_false>._M_head_impl =
       (tuple<duckdb::TableFilterSet_*,_std::default_delete<duckdb::TableFilterSet>_>)
       (tuple<duckdb::TableFilterSet_*,_std::default_delete<duckdb::TableFilterSet>_>)this;
  make_uniq<duckdb::TableFilterSet>();
  if (in_RCX != 0) {
    pTVar3 = optional_ptr<duckdb::TableFilterSet,_true>::operator->(&local_58);
    for (p_Var6 = (pTVar3->filters)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != &(pTVar3->filters)._M_t._M_impl.super__Rb_tree_header;
        p_Var6 = (_Base_ptr)::std::_Rb_tree_increment(p_Var6)) {
      pTVar4 = unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>
               ::operator->((unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>
                             *)&local_80);
      local_50.index = *(idx_t *)(p_Var6 + 1);
      local_50.child_indexes.super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
      .super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_50.child_indexes.super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
      .super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_50.child_indexes.super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
      .super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pTVar5 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
               operator->((unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                           *)&p_Var6[1]._M_parent);
      (*pTVar5->_vptr_TableFilter[4])(&local_70,pTVar5);
      TableFilterSet::PushFilter
                (pTVar4,&local_50,
                 (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *)
                 &local_70);
      if (local_70._M_head_impl != (TableFilter *)0x0) {
        (*(local_70._M_head_impl)->_vptr_TableFilter[1])();
      }
      local_70._M_head_impl = (TableFilter *)0x0;
      ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::~vector
                (&local_50.child_indexes.
                  super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>);
    }
  }
  local_68 = (PhysicalTableScan *)
             &(local_68->super_PhysicalOperator).types.
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  while (pLVar1 = *(pointer *)local_68, pLVar1 != (pointer)0x0) {
    local_68 = (PhysicalTableScan *)pLVar1;
    pTVar4 = unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>::
             operator->((unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>
                         *)&(pLVar1->type_info_).internal.
                            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
    for (p_Var6 = (pTVar4->filters)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != &(pTVar4->filters)._M_t._M_impl.super__Rb_tree_header;
        p_Var6 = (_Base_ptr)::std::_Rb_tree_increment(p_Var6)) {
      this_00 = unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>
                ::operator->((unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>
                              *)&local_80);
      local_50.index = *(idx_t *)(p_Var6 + 1);
      local_50.child_indexes.super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
      .super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_50.child_indexes.super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
      .super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_50.child_indexes.super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
      .super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pTVar5 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
               operator->((unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                           *)&p_Var6[1]._M_parent);
      (*pTVar5->_vptr_TableFilter[4])(&local_78,pTVar5);
      TableFilterSet::PushFilter
                (this_00,&local_50,
                 (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *)
                 &local_78);
      if (local_78._M_head_impl != (TableFilter *)0x0) {
        (*(local_78._M_head_impl)->_vptr_TableFilter[1])();
      }
      local_78._M_head_impl = (TableFilter *)0x0;
      ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::~vector
                (&local_50.child_indexes.
                  super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>);
    }
  }
  pTVar4 = unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>::
           operator->((unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>
                       *)&local_80);
  _Var2._M_t.
  super__Tuple_impl<0UL,_duckdb::TableFilterSet_*,_std::default_delete<duckdb::TableFilterSet>_>.
  super__Head_base<0UL,_duckdb::TableFilterSet_*,_false>._M_head_impl =
       local_60._M_t.
       super__Tuple_impl<0UL,_duckdb::TableFilterSet_*,_std::default_delete<duckdb::TableFilterSet>_>
       .super__Head_base<0UL,_duckdb::TableFilterSet_*,_false>._M_head_impl;
  _Var7._M_head_impl = local_80._M_head_impl;
  if ((pTVar4->filters)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    _Var7._M_head_impl = (TableFilterSet *)0x0;
  }
  else {
    local_80._M_head_impl = (TableFilterSet *)0x0;
  }
  *(TableFilterSet **)
   local_60._M_t.
   super__Tuple_impl<0UL,_duckdb::TableFilterSet_*,_std::default_delete<duckdb::TableFilterSet>_>.
   super__Head_base<0UL,_duckdb::TableFilterSet_*,_false>._M_head_impl = _Var7._M_head_impl;
  ::std::unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>::
  ~unique_ptr((unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_> *)
              &local_80);
  return (unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>)
         (_Tuple_impl<0UL,_duckdb::TableFilterSet_*,_std::default_delete<duckdb::TableFilterSet>_>)
         _Var2._M_t.
         super__Tuple_impl<0UL,_duckdb::TableFilterSet_*,_std::default_delete<duckdb::TableFilterSet>_>
         .super__Head_base<0UL,_duckdb::TableFilterSet_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<TableFilterSet>
DynamicTableFilterSet::GetFinalTableFilters(const PhysicalTableScan &scan,
                                            optional_ptr<TableFilterSet> existing_filters) const {
	D_ASSERT(HasFilters());
	auto result = make_uniq<TableFilterSet>();
	if (existing_filters) {
		for (auto &entry : existing_filters->filters) {
			result->PushFilter(ColumnIndex(entry.first), entry.second->Copy());
		}
	}
	for (auto &entry : filters) {
		for (auto &filter : entry.second->filters) {
			result->PushFilter(ColumnIndex(filter.first), filter.second->Copy());
		}
	}
	if (result->filters.empty()) {
		return nullptr;
	}
	return result;
}